

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexCache.cpp
# Opt level: O3

void __thiscall
Ptex::v2_2::PtexReaderCache::Purger::operator()(Purger *this,PtexCachedReader *reader)

{
  size_t sVar1;
  size_t sVar2;
  bool bVar3;
  
  LOCK();
  bVar3 = reader->_refCount == 0;
  if (bVar3) {
    reader->_refCount = -1;
  }
  UNLOCK();
  if (bVar3) {
    PtexReader::purge(&reader->super_PtexReader);
    sVar1 = (reader->super_PtexReader)._memUsed;
    sVar2 = reader->_memUsedAccountedFor;
    reader->_memUsedAccountedFor = sVar1;
    reader->_refCount = 0;
    this->memUsedChangeTotal = this->memUsedChangeTotal + (sVar1 - sVar2);
  }
  else {
    (reader->super_PtexReader)._pendingPurge = true;
  }
  return;
}

Assistant:

void PtexReaderCache::Purger::operator()(PtexCachedReader* reader)
{
    size_t memUsedChange;
    if (reader->tryPurge(memUsedChange)) {
        memUsedChangeTotal += memUsedChange;
    }
}